

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

void LoadOpenGLFunctions(void)

{
  int iVar1;
  openglfn_glGetError_t p_Var2;
  GLubyte *pGVar3;
  int major;
  int minor;
  int local_10 [2];
  
  p_Var2 = (openglfn_glGetError_t)0x0;
  local_10[0] = 0;
  local_10[1] = 0;
  (*SDL20_memset)(&OpenGLFuncs,0,0x1c0);
  OpenGLFuncs.SUPPORTS_Core = SDL_TRUE;
  OpenGLFuncs.glGetString = (openglfn_glGetString_t)(*SDL20_GL_GetProcAddress)("glGetString");
  if (OpenGLFuncs.SUPPORTS_Core != SDL_FALSE) {
    p_Var2 = (openglfn_glGetError_t)(*SDL20_GL_GetProcAddress)("glGetError");
  }
  OpenGLFuncs.glGetError = p_Var2;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glClear = (openglfn_glClear_t)0x0;
  }
  else {
    OpenGLFuncs.glClear = (openglfn_glClear_t)(*SDL20_GL_GetProcAddress)("glClear");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glIsEnabled = (openglfn_glIsEnabled_t)0x0;
  }
  else {
    OpenGLFuncs.glIsEnabled = (openglfn_glIsEnabled_t)(*SDL20_GL_GetProcAddress)("glIsEnabled");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glEnable = (openglfn_glEnable_t)0x0;
  }
  else {
    OpenGLFuncs.glEnable = (openglfn_glEnable_t)(*SDL20_GL_GetProcAddress)("glEnable");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glDisable = (openglfn_glDisable_t)0x0;
  }
  else {
    OpenGLFuncs.glDisable = (openglfn_glDisable_t)(*SDL20_GL_GetProcAddress)("glDisable");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glGetFloatv = (openglfn_glGetFloatv_t)0x0;
  }
  else {
    OpenGLFuncs.glGetFloatv = (openglfn_glGetFloatv_t)(*SDL20_GL_GetProcAddress)("glGetFloatv");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glGetIntegerv = (openglfn_glGetIntegerv_t)0x0;
  }
  else {
    OpenGLFuncs.glGetIntegerv =
         (openglfn_glGetIntegerv_t)(*SDL20_GL_GetProcAddress)("glGetIntegerv");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glClearColor = (openglfn_glClearColor_t)0x0;
  }
  else {
    OpenGLFuncs.glClearColor = (openglfn_glClearColor_t)(*SDL20_GL_GetProcAddress)("glClearColor");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glViewport = (openglfn_glViewport_t)0x0;
  }
  else {
    OpenGLFuncs.glViewport = (openglfn_glViewport_t)(*SDL20_GL_GetProcAddress)("glViewport");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glScissor = (openglfn_glScissor_t)0x0;
  }
  else {
    OpenGLFuncs.glScissor = (openglfn_glScissor_t)(*SDL20_GL_GetProcAddress)("glScissor");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glReadPixels = (openglfn_glReadPixels_t)0x0;
  }
  else {
    OpenGLFuncs.glReadPixels = (openglfn_glReadPixels_t)(*SDL20_GL_GetProcAddress)("glReadPixels");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyPixels = (openglfn_glCopyPixels_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyPixels = (openglfn_glCopyPixels_t)(*SDL20_GL_GetProcAddress)("glCopyPixels");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyTexImage1D = (openglfn_glCopyTexImage1D_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyTexImage1D =
         (openglfn_glCopyTexImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage1D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyTexSubImage1D = (openglfn_glCopyTexSubImage1D_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyTexSubImage1D =
         (openglfn_glCopyTexSubImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage1D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyTexImage2D = (openglfn_glCopyTexImage2D_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyTexImage2D =
         (openglfn_glCopyTexImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage2D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyTexSubImage2D = (openglfn_glCopyTexSubImage2D_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyTexSubImage2D =
         (openglfn_glCopyTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage2D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyTexSubImage3D = (openglfn_glCopyTexSubImage3D_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyTexSubImage3D =
         (openglfn_glCopyTexSubImage3D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage3D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glDeleteTextures = (openglfn_glDeleteTextures_t)0x0;
  }
  else {
    OpenGLFuncs.glDeleteTextures =
         (openglfn_glDeleteTextures_t)(*SDL20_GL_GetProcAddress)("glDeleteTextures");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glGenTextures = (openglfn_glGenTextures_t)0x0;
  }
  else {
    OpenGLFuncs.glGenTextures =
         (openglfn_glGenTextures_t)(*SDL20_GL_GetProcAddress)("glGenTextures");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPopAttrib = (openglfn_glPopAttrib_t)0x0;
  }
  else {
    OpenGLFuncs.glPopAttrib = (openglfn_glPopAttrib_t)(*SDL20_GL_GetProcAddress)("glPopAttrib");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPopClientAttrib = (openglfn_glPopClientAttrib_t)0x0;
  }
  else {
    OpenGLFuncs.glPopClientAttrib =
         (openglfn_glPopClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPopClientAttrib");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPopMatrix = (openglfn_glPopMatrix_t)0x0;
  }
  else {
    OpenGLFuncs.glPopMatrix = (openglfn_glPopMatrix_t)(*SDL20_GL_GetProcAddress)("glPopMatrix");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glBegin = (openglfn_glBegin_t)0x0;
  }
  else {
    OpenGLFuncs.glBegin = (openglfn_glBegin_t)(*SDL20_GL_GetProcAddress)("glBegin");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPushAttrib = (openglfn_glPushAttrib_t)0x0;
  }
  else {
    OpenGLFuncs.glPushAttrib = (openglfn_glPushAttrib_t)(*SDL20_GL_GetProcAddress)("glPushAttrib");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPushClientAttrib = (openglfn_glPushClientAttrib_t)0x0;
  }
  else {
    OpenGLFuncs.glPushClientAttrib =
         (openglfn_glPushClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPushClientAttrib");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glBindTexture = (openglfn_glBindTexture_t)0x0;
  }
  else {
    OpenGLFuncs.glBindTexture =
         (openglfn_glBindTexture_t)(*SDL20_GL_GetProcAddress)("glBindTexture");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glEnd = (openglfn_glEnd_t)0x0;
  }
  else {
    OpenGLFuncs.glEnd = (openglfn_glEnd_t)(*SDL20_GL_GetProcAddress)("glEnd");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glTexEnvf = (openglfn_glTexEnvf_t)0x0;
  }
  else {
    OpenGLFuncs.glTexEnvf = (openglfn_glTexEnvf_t)(*SDL20_GL_GetProcAddress)("glTexEnvf");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glTexParameteri = (openglfn_glTexParameteri_t)0x0;
  }
  else {
    OpenGLFuncs.glTexParameteri =
         (openglfn_glTexParameteri_t)(*SDL20_GL_GetProcAddress)("glTexParameteri");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPixelStorei = (openglfn_glPixelStorei_t)0x0;
  }
  else {
    OpenGLFuncs.glPixelStorei =
         (openglfn_glPixelStorei_t)(*SDL20_GL_GetProcAddress)("glPixelStorei");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glBlendFunc = (openglfn_glBlendFunc_t)0x0;
  }
  else {
    OpenGLFuncs.glBlendFunc = (openglfn_glBlendFunc_t)(*SDL20_GL_GetProcAddress)("glBlendFunc");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glColor4f = (openglfn_glColor4f_t)0x0;
  }
  else {
    OpenGLFuncs.glColor4f = (openglfn_glColor4f_t)(*SDL20_GL_GetProcAddress)("glColor4f");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glMatrixMode = (openglfn_glMatrixMode_t)0x0;
  }
  else {
    OpenGLFuncs.glMatrixMode = (openglfn_glMatrixMode_t)(*SDL20_GL_GetProcAddress)("glMatrixMode");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glLoadIdentity = (openglfn_glLoadIdentity_t)0x0;
  }
  else {
    OpenGLFuncs.glLoadIdentity =
         (openglfn_glLoadIdentity_t)(*SDL20_GL_GetProcAddress)("glLoadIdentity");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPushMatrix = (openglfn_glPushMatrix_t)0x0;
  }
  else {
    OpenGLFuncs.glPushMatrix = (openglfn_glPushMatrix_t)(*SDL20_GL_GetProcAddress)("glPushMatrix");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glOrtho = (openglfn_glOrtho_t)0x0;
  }
  else {
    OpenGLFuncs.glOrtho = (openglfn_glOrtho_t)(*SDL20_GL_GetProcAddress)("glOrtho");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glTexImage2D = (openglfn_glTexImage2D_t)0x0;
  }
  else {
    OpenGLFuncs.glTexImage2D = (openglfn_glTexImage2D_t)(*SDL20_GL_GetProcAddress)("glTexImage2D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glTexSubImage2D = (openglfn_glTexSubImage2D_t)0x0;
  }
  else {
    OpenGLFuncs.glTexSubImage2D =
         (openglfn_glTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glTexSubImage2D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glVertex2i = (openglfn_glVertex2i_t)0x0;
  }
  else {
    OpenGLFuncs.glVertex2i = (openglfn_glVertex2i_t)(*SDL20_GL_GetProcAddress)("glVertex2i");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glTexCoord2f = (openglfn_glTexCoord2f_t)0x0;
  }
  else {
    OpenGLFuncs.glTexCoord2f = (openglfn_glTexCoord2f_t)(*SDL20_GL_GetProcAddress)("glTexCoord2f");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glBindRenderbuffer = (openglfn_glBindRenderbuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glBindRenderbuffer =
         (openglfn_glBindRenderbuffer_t)(*SDL20_GL_GetProcAddress)("glBindRenderbuffer");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glDeleteRenderbuffers = (openglfn_glDeleteRenderbuffers_t)0x0;
  }
  else {
    OpenGLFuncs.glDeleteRenderbuffers =
         (openglfn_glDeleteRenderbuffers_t)(*SDL20_GL_GetProcAddress)("glDeleteRenderbuffers");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glGenRenderbuffers = (openglfn_glGenRenderbuffers_t)0x0;
  }
  else {
    OpenGLFuncs.glGenRenderbuffers =
         (openglfn_glGenRenderbuffers_t)(*SDL20_GL_GetProcAddress)("glGenRenderbuffers");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glRenderbufferStorage = (openglfn_glRenderbufferStorage_t)0x0;
  }
  else {
    OpenGLFuncs.glRenderbufferStorage =
         (openglfn_glRenderbufferStorage_t)(*SDL20_GL_GetProcAddress)("glRenderbufferStorage");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glRenderbufferStorageMultisample = (openglfn_glRenderbufferStorageMultisample_t)0x0;
  }
  else {
    OpenGLFuncs.glRenderbufferStorageMultisample =
         (openglfn_glRenderbufferStorageMultisample_t)
         (*SDL20_GL_GetProcAddress)("glRenderbufferStorageMultisample");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glGetRenderbufferParameteriv = (openglfn_glGetRenderbufferParameteriv_t)0x0;
  }
  else {
    OpenGLFuncs.glGetRenderbufferParameteriv =
         (openglfn_glGetRenderbufferParameteriv_t)
         (*SDL20_GL_GetProcAddress)("glGetRenderbufferParameteriv");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glIsFramebuffer = (openglfn_glIsFramebuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glIsFramebuffer =
         (openglfn_glIsFramebuffer_t)(*SDL20_GL_GetProcAddress)("glIsFramebuffer");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glBindFramebuffer = (openglfn_glBindFramebuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glBindFramebuffer =
         (openglfn_glBindFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBindFramebuffer");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
  }
  else {
    OpenGLFuncs.glDeleteFramebuffers =
         (openglfn_glDeleteFramebuffers_t)(*SDL20_GL_GetProcAddress)("glDeleteFramebuffers");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
  }
  else {
    OpenGLFuncs.glGenFramebuffers =
         (openglfn_glGenFramebuffers_t)(*SDL20_GL_GetProcAddress)("glGenFramebuffers");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
  }
  else {
    OpenGLFuncs.glCheckFramebufferStatus =
         (openglfn_glCheckFramebufferStatus_t)(*SDL20_GL_GetProcAddress)("glCheckFramebufferStatus")
    ;
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glFramebufferRenderbuffer =
         (openglfn_glFramebufferRenderbuffer_t)
         (*SDL20_GL_GetProcAddress)("glFramebufferRenderbuffer");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glBlitFramebuffer =
         (openglfn_glBlitFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBlitFramebuffer");
  }
  pGVar3 = (*OpenGLFuncs.glGetString)(0x1f02);
  if (pGVar3 != (GLubyte *)0x0) {
    iVar1 = (*SDL20_sscanf)((char *)pGVar3,"%d.%d",local_10,local_10 + 1);
    if (iVar1 == 2) goto LAB_00115a83;
  }
  local_10[1] = 0;
  local_10[0] = 0;
LAB_00115a83:
  OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object =
       (*SDL20_GL_ExtensionSupported)("GL_ARB_framebuffer_object");
  OpenGLFuncs.SUPPORTS_GL_ARB_texture_non_power_of_two =
       (*SDL20_GL_ExtensionSupported)("GL_ARB_texture_non_power_of_two");
  if (2 < local_10[0]) {
    OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object = SDL_TRUE;
  }
  if (1 < local_10[0]) {
    OpenGLFuncs.SUPPORTS_GL_ARB_texture_non_power_of_two = SDL_TRUE;
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glGetString = (openglfn_glGetString_t)0x0;
  }
  else {
    OpenGLFuncs.glGetString = (openglfn_glGetString_t)(*SDL20_GL_GetProcAddress)("glGetString");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glGetError = (openglfn_glGetError_t)0x0;
  }
  else {
    OpenGLFuncs.glGetError = (openglfn_glGetError_t)(*SDL20_GL_GetProcAddress)("glGetError");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glClear = (openglfn_glClear_t)0x0;
  }
  else {
    OpenGLFuncs.glClear = (openglfn_glClear_t)(*SDL20_GL_GetProcAddress)("glClear");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glIsEnabled = (openglfn_glIsEnabled_t)0x0;
  }
  else {
    OpenGLFuncs.glIsEnabled = (openglfn_glIsEnabled_t)(*SDL20_GL_GetProcAddress)("glIsEnabled");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glEnable = (openglfn_glEnable_t)0x0;
  }
  else {
    OpenGLFuncs.glEnable = (openglfn_glEnable_t)(*SDL20_GL_GetProcAddress)("glEnable");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glDisable = (openglfn_glDisable_t)0x0;
  }
  else {
    OpenGLFuncs.glDisable = (openglfn_glDisable_t)(*SDL20_GL_GetProcAddress)("glDisable");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glGetFloatv = (openglfn_glGetFloatv_t)0x0;
  }
  else {
    OpenGLFuncs.glGetFloatv = (openglfn_glGetFloatv_t)(*SDL20_GL_GetProcAddress)("glGetFloatv");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glGetIntegerv = (openglfn_glGetIntegerv_t)0x0;
  }
  else {
    OpenGLFuncs.glGetIntegerv =
         (openglfn_glGetIntegerv_t)(*SDL20_GL_GetProcAddress)("glGetIntegerv");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glClearColor = (openglfn_glClearColor_t)0x0;
  }
  else {
    OpenGLFuncs.glClearColor = (openglfn_glClearColor_t)(*SDL20_GL_GetProcAddress)("glClearColor");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glViewport = (openglfn_glViewport_t)0x0;
  }
  else {
    OpenGLFuncs.glViewport = (openglfn_glViewport_t)(*SDL20_GL_GetProcAddress)("glViewport");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glScissor = (openglfn_glScissor_t)0x0;
  }
  else {
    OpenGLFuncs.glScissor = (openglfn_glScissor_t)(*SDL20_GL_GetProcAddress)("glScissor");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glReadPixels = (openglfn_glReadPixels_t)0x0;
  }
  else {
    OpenGLFuncs.glReadPixels = (openglfn_glReadPixels_t)(*SDL20_GL_GetProcAddress)("glReadPixels");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyPixels = (openglfn_glCopyPixels_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyPixels = (openglfn_glCopyPixels_t)(*SDL20_GL_GetProcAddress)("glCopyPixels");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyTexImage1D = (openglfn_glCopyTexImage1D_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyTexImage1D =
         (openglfn_glCopyTexImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage1D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyTexSubImage1D = (openglfn_glCopyTexSubImage1D_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyTexSubImage1D =
         (openglfn_glCopyTexSubImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage1D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyTexImage2D = (openglfn_glCopyTexImage2D_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyTexImage2D =
         (openglfn_glCopyTexImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage2D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyTexSubImage2D = (openglfn_glCopyTexSubImage2D_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyTexSubImage2D =
         (openglfn_glCopyTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage2D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glCopyTexSubImage3D = (openglfn_glCopyTexSubImage3D_t)0x0;
  }
  else {
    OpenGLFuncs.glCopyTexSubImage3D =
         (openglfn_glCopyTexSubImage3D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage3D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glDeleteTextures = (openglfn_glDeleteTextures_t)0x0;
  }
  else {
    OpenGLFuncs.glDeleteTextures =
         (openglfn_glDeleteTextures_t)(*SDL20_GL_GetProcAddress)("glDeleteTextures");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glGenTextures = (openglfn_glGenTextures_t)0x0;
  }
  else {
    OpenGLFuncs.glGenTextures =
         (openglfn_glGenTextures_t)(*SDL20_GL_GetProcAddress)("glGenTextures");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPopAttrib = (openglfn_glPopAttrib_t)0x0;
  }
  else {
    OpenGLFuncs.glPopAttrib = (openglfn_glPopAttrib_t)(*SDL20_GL_GetProcAddress)("glPopAttrib");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPopClientAttrib = (openglfn_glPopClientAttrib_t)0x0;
  }
  else {
    OpenGLFuncs.glPopClientAttrib =
         (openglfn_glPopClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPopClientAttrib");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPopMatrix = (openglfn_glPopMatrix_t)0x0;
  }
  else {
    OpenGLFuncs.glPopMatrix = (openglfn_glPopMatrix_t)(*SDL20_GL_GetProcAddress)("glPopMatrix");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glBegin = (openglfn_glBegin_t)0x0;
  }
  else {
    OpenGLFuncs.glBegin = (openglfn_glBegin_t)(*SDL20_GL_GetProcAddress)("glBegin");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPushAttrib = (openglfn_glPushAttrib_t)0x0;
  }
  else {
    OpenGLFuncs.glPushAttrib = (openglfn_glPushAttrib_t)(*SDL20_GL_GetProcAddress)("glPushAttrib");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPushClientAttrib = (openglfn_glPushClientAttrib_t)0x0;
  }
  else {
    OpenGLFuncs.glPushClientAttrib =
         (openglfn_glPushClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPushClientAttrib");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glBindTexture = (openglfn_glBindTexture_t)0x0;
  }
  else {
    OpenGLFuncs.glBindTexture =
         (openglfn_glBindTexture_t)(*SDL20_GL_GetProcAddress)("glBindTexture");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glEnd = (openglfn_glEnd_t)0x0;
  }
  else {
    OpenGLFuncs.glEnd = (openglfn_glEnd_t)(*SDL20_GL_GetProcAddress)("glEnd");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glTexEnvf = (openglfn_glTexEnvf_t)0x0;
  }
  else {
    OpenGLFuncs.glTexEnvf = (openglfn_glTexEnvf_t)(*SDL20_GL_GetProcAddress)("glTexEnvf");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glTexParameteri = (openglfn_glTexParameteri_t)0x0;
  }
  else {
    OpenGLFuncs.glTexParameteri =
         (openglfn_glTexParameteri_t)(*SDL20_GL_GetProcAddress)("glTexParameteri");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPixelStorei = (openglfn_glPixelStorei_t)0x0;
  }
  else {
    OpenGLFuncs.glPixelStorei =
         (openglfn_glPixelStorei_t)(*SDL20_GL_GetProcAddress)("glPixelStorei");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glBlendFunc = (openglfn_glBlendFunc_t)0x0;
  }
  else {
    OpenGLFuncs.glBlendFunc = (openglfn_glBlendFunc_t)(*SDL20_GL_GetProcAddress)("glBlendFunc");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glColor4f = (openglfn_glColor4f_t)0x0;
  }
  else {
    OpenGLFuncs.glColor4f = (openglfn_glColor4f_t)(*SDL20_GL_GetProcAddress)("glColor4f");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glMatrixMode = (openglfn_glMatrixMode_t)0x0;
  }
  else {
    OpenGLFuncs.glMatrixMode = (openglfn_glMatrixMode_t)(*SDL20_GL_GetProcAddress)("glMatrixMode");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glLoadIdentity = (openglfn_glLoadIdentity_t)0x0;
  }
  else {
    OpenGLFuncs.glLoadIdentity =
         (openglfn_glLoadIdentity_t)(*SDL20_GL_GetProcAddress)("glLoadIdentity");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glPushMatrix = (openglfn_glPushMatrix_t)0x0;
  }
  else {
    OpenGLFuncs.glPushMatrix = (openglfn_glPushMatrix_t)(*SDL20_GL_GetProcAddress)("glPushMatrix");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glOrtho = (openglfn_glOrtho_t)0x0;
  }
  else {
    OpenGLFuncs.glOrtho = (openglfn_glOrtho_t)(*SDL20_GL_GetProcAddress)("glOrtho");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glTexImage2D = (openglfn_glTexImage2D_t)0x0;
  }
  else {
    OpenGLFuncs.glTexImage2D = (openglfn_glTexImage2D_t)(*SDL20_GL_GetProcAddress)("glTexImage2D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glTexSubImage2D = (openglfn_glTexSubImage2D_t)0x0;
  }
  else {
    OpenGLFuncs.glTexSubImage2D =
         (openglfn_glTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glTexSubImage2D");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glVertex2i = (openglfn_glVertex2i_t)0x0;
  }
  else {
    OpenGLFuncs.glVertex2i = (openglfn_glVertex2i_t)(*SDL20_GL_GetProcAddress)("glVertex2i");
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glTexCoord2f = (openglfn_glTexCoord2f_t)0x0;
  }
  else {
    OpenGLFuncs.glTexCoord2f = (openglfn_glTexCoord2f_t)(*SDL20_GL_GetProcAddress)("glTexCoord2f");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glBindRenderbuffer = (openglfn_glBindRenderbuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glBindRenderbuffer =
         (openglfn_glBindRenderbuffer_t)(*SDL20_GL_GetProcAddress)("glBindRenderbuffer");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glDeleteRenderbuffers = (openglfn_glDeleteRenderbuffers_t)0x0;
  }
  else {
    OpenGLFuncs.glDeleteRenderbuffers =
         (openglfn_glDeleteRenderbuffers_t)(*SDL20_GL_GetProcAddress)("glDeleteRenderbuffers");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glGenRenderbuffers = (openglfn_glGenRenderbuffers_t)0x0;
  }
  else {
    OpenGLFuncs.glGenRenderbuffers =
         (openglfn_glGenRenderbuffers_t)(*SDL20_GL_GetProcAddress)("glGenRenderbuffers");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glRenderbufferStorage = (openglfn_glRenderbufferStorage_t)0x0;
  }
  else {
    OpenGLFuncs.glRenderbufferStorage =
         (openglfn_glRenderbufferStorage_t)(*SDL20_GL_GetProcAddress)("glRenderbufferStorage");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glRenderbufferStorageMultisample = (openglfn_glRenderbufferStorageMultisample_t)0x0;
  }
  else {
    OpenGLFuncs.glRenderbufferStorageMultisample =
         (openglfn_glRenderbufferStorageMultisample_t)
         (*SDL20_GL_GetProcAddress)("glRenderbufferStorageMultisample");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glGetRenderbufferParameteriv = (openglfn_glGetRenderbufferParameteriv_t)0x0;
  }
  else {
    OpenGLFuncs.glGetRenderbufferParameteriv =
         (openglfn_glGetRenderbufferParameteriv_t)
         (*SDL20_GL_GetProcAddress)("glGetRenderbufferParameteriv");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glIsFramebuffer = (openglfn_glIsFramebuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glIsFramebuffer =
         (openglfn_glIsFramebuffer_t)(*SDL20_GL_GetProcAddress)("glIsFramebuffer");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glBindFramebuffer = (openglfn_glBindFramebuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glBindFramebuffer =
         (openglfn_glBindFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBindFramebuffer");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
  }
  else {
    OpenGLFuncs.glDeleteFramebuffers =
         (openglfn_glDeleteFramebuffers_t)(*SDL20_GL_GetProcAddress)("glDeleteFramebuffers");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
  }
  else {
    OpenGLFuncs.glGenFramebuffers =
         (openglfn_glGenFramebuffers_t)(*SDL20_GL_GetProcAddress)("glGenFramebuffers");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
  }
  else {
    OpenGLFuncs.glCheckFramebufferStatus =
         (openglfn_glCheckFramebufferStatus_t)(*SDL20_GL_GetProcAddress)("glCheckFramebufferStatus")
    ;
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glFramebufferRenderbuffer =
         (openglfn_glFramebufferRenderbuffer_t)
         (*SDL20_GL_GetProcAddress)("glFramebufferRenderbuffer");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glBlitFramebuffer =
         (openglfn_glBlitFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBlitFramebuffer");
  }
  return;
}

Assistant:

static void
LoadOpenGLFunctions(void)
{
    const char *version;
    int major = 0, minor = 0;

    /* load core functions so we can guess about a few other things. */
    SDL20_zero(OpenGLFuncs);
    OpenGLFuncs.SUPPORTS_Core = SDL_TRUE;
    #define OPENGL_SYM(ext,rc,fn,params,args,ret) OpenGLFuncs.fn = \
           (OpenGLFuncs.SUPPORTS_##ext)? (openglfn_##fn##_t)SDL20_GL_GetProcAddress(#fn) : NULL;
    #include "SDL20_syms.h"

    version = (const char *) OpenGLFuncs.glGetString(GL_VERSION);
    if (!version || (SDL20_sscanf(version, "%d.%d", &major, &minor) != 2)) {
        major = minor = 0;
    }

    /* Lookup reported extensions. */
    #define OPENGL_EXT(name) OpenGLFuncs.SUPPORTS_##name = SDL20_GL_ExtensionSupported(#name);
    #include "SDL20_syms.h"

    /* GL_ARB_framebuffer_object is in core OpenGL 3.0+ with the same entry point names as the extension version. */
    if (major >= 3) {
        OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object = SDL_TRUE;
    }

    if (major >= 2) {
        OpenGLFuncs.SUPPORTS_GL_ARB_texture_non_power_of_two = SDL_TRUE;  /* core since 2.0 */
    }

    /* load everything we can. */
    #define OPENGL_SYM(ext,rc,fn,params,args,ret) OpenGLFuncs.fn = \
           (OpenGLFuncs.SUPPORTS_##ext)? (openglfn_##fn##_t)SDL20_GL_GetProcAddress(#fn) : NULL;
    #include "SDL20_syms.h"
}